

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadQuaternion(OgreBinarySerializer *this,aiQuaternion *quat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  
  pfVar4 = (float *)this->m_reader->current;
  StreamReader<false,_false>::SetPtr(this->m_reader,(int8_t *)(pfVar4 + 4));
  fVar1 = pfVar4[1];
  fVar2 = pfVar4[2];
  fVar3 = pfVar4[3];
  quat->x = *pfVar4;
  quat->y = fVar1;
  quat->z = fVar2;
  quat->w = fVar3;
  return;
}

Assistant:

void OgreBinarySerializer::ReadQuaternion(aiQuaternion &quat)
{
    float temp[4];
    m_reader->CopyAndAdvance(temp, sizeof(float)*4);
    quat.x = temp[0];
    quat.y = temp[1];
    quat.z = temp[2];
    quat.w = temp[3];
}